

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O0

bool __thiscall glslang::HlslGrammar::acceptPostfixExpression(HlslGrammar *this,TIntermTyped **node)

{
  HlslParseContext *this_00;
  bool bVar1;
  EHlslTokenClass op;
  int iVar2;
  char *s;
  TIntermTyped *pTVar3;
  undefined4 extraout_var;
  TIntermTyped *local_a8;
  TIntermTyped *indexNode;
  TIntermTyped *thisNode;
  HlslToken field;
  undefined1 auStack_68 [4];
  TOperator postOp;
  TSourceLoc loc;
  TString *fullName;
  HlslToken idToken;
  TIntermTyped **node_local;
  HlslGrammar *this_local;
  
  idToken.field_2 = (anon_union_8_5_54ae9b2d_for_HlslToken_2)node;
  HlslToken::HlslToken((HlslToken *)&fullName);
  bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftParen);
  if (bVar1) {
    bVar1 = acceptExpression(this,idToken.field_2);
    if (!bVar1) {
      expected(this,"expression");
      return false;
    }
    bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightParen);
    if (!bVar1) {
      expected(this,")");
      return false;
    }
  }
  else {
    bVar1 = acceptLiteral(this,idToken.field_2);
    if ((!bVar1) && (bVar1 = acceptConstructor(this,idToken.field_2), !bVar1)) {
      bVar1 = acceptIdentifier(this,(HlslToken *)&fullName);
      if (!bVar1) {
        return false;
      }
      loc.column = idToken.tokenClass;
      loc._20_4_ = idToken._28_4_;
      while (bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokColonColon)
            , bVar1) {
        s = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::c_str((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                    loc._16_8_);
        loc._16_8_ = NewPoolTString_abi_cxx11_(s);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               loc._16_8_,(this->parseContext->super_TParseContextBase).scopeMangler);
        bVar1 = acceptIdentifier(this,(HlslToken *)&fullName);
        if (!bVar1) {
          expected(this,"identifier after ::");
          return false;
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               loc._16_8_,
               (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               idToken._24_8_);
      }
      bVar1 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokLeftParen);
      if (bVar1) {
        bVar1 = acceptFunctionCall(this,(TSourceLoc *)&fullName,(TString *)loc._16_8_,
                                   idToken.field_2,(TIntermTyped *)0x0);
        if (!bVar1) {
          expected(this,"function call arguments");
          return false;
        }
      }
      else {
        pTVar3 = HlslParseContext::handleVariable
                           (this->parseContext,(TSourceLoc *)&fullName,(TString *)loc._16_8_);
        ((idToken.field_2.string)->_M_dataplus).super_allocator_type.allocator =
             (TPoolAllocator *)pTVar3;
        if (((idToken.field_2.string)->_M_dataplus).super_allocator_type.allocator ==
            (TPoolAllocator *)0x0) {
          return false;
        }
      }
    }
  }
  while( true ) {
    loc.string = (this->super_HlslTokenStream).token.loc.column;
    loc.line = *(int *)&(this->super_HlslTokenStream).token.loc.field_0x14;
    _auStack_68 = (this->super_HlslTokenStream).token.loc.name;
    loc.name = *(TString **)&(this->super_HlslTokenStream).token.loc.string;
    op = HlslTokenStream::peek(&this->super_HlslTokenStream);
    field.field_2._4_4_ = HlslOpMap::postUnary(op);
    if (((1 < field.field_2._4_4_ - EOpPostIncrement) &&
        (1 < field.field_2._4_4_ - EOpIndexIndirect)) && (field.field_2._4_4_ != EOpScoping)) break;
    HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
    switch(field.field_2._4_4_) {
    case 0xc:
    case 0xd:
      pTVar3 = TIntermediate::addUnaryMath
                         (this->intermediate,field.field_2._4_4_,
                          (TIntermTyped *)
                          ((idToken.field_2.string)->_M_dataplus).super_allocator_type.allocator,
                          (TSourceLoc *)auStack_68);
      ((idToken.field_2.string)->_M_dataplus).super_allocator_type.allocator =
           (TPoolAllocator *)pTVar3;
      pTVar3 = HlslParseContext::handleLvalue
                         (this->parseContext,(TSourceLoc *)auStack_68,"unary operator",
                          (TIntermTyped **)idToken.field_2.string);
      ((idToken.field_2.string)->_M_dataplus).super_allocator_type.allocator =
           (TPoolAllocator *)pTVar3;
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslGrammar.cpp"
                    ,0xdb2,"bool glslang::HlslGrammar::acceptPostfixExpression(TIntermTyped *&)");
    case 0x34:
      local_a8 = (TIntermTyped *)0x0;
      bVar1 = acceptExpression(this,&local_a8);
      if ((!bVar1) ||
         (bVar1 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokRightBracket),
         !bVar1)) {
        expected(this,"expression followed by \']\'");
        return false;
      }
      HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
      this_00 = this->parseContext;
      iVar2 = (**(local_a8->super_TIntermNode)._vptr_TIntermNode)();
      pTVar3 = HlslParseContext::handleBracketDereference
                         (this_00,(TSourceLoc *)CONCAT44(extraout_var,iVar2),
                          (TIntermTyped *)
                          ((idToken.field_2.string)->_M_dataplus).super_allocator_type.allocator,
                          local_a8);
      ((idToken.field_2.string)->_M_dataplus).super_allocator_type.allocator =
           (TPoolAllocator *)pTVar3;
      if (((idToken.field_2.string)->_M_dataplus).super_allocator_type.allocator ==
          (TPoolAllocator *)0x0) {
        return false;
      }
      break;
    case 0x35:
    case 0x38:
      HlslToken::HlslToken((HlslToken *)&thisNode);
      bVar1 = acceptIdentifier(this,(HlslToken *)&thisNode);
      if (!bVar1) {
        expected(this,"swizzle or member");
        return false;
      }
      bVar1 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokLeftParen);
      if (bVar1) {
        indexNode = (TIntermTyped *)
                    ((idToken.field_2.string)->_M_dataplus).super_allocator_type.allocator;
        bVar1 = acceptFunctionCall(this,(TSourceLoc *)&thisNode,(TString *)field._24_8_,
                                   idToken.field_2,indexNode);
        if (!bVar1) {
          expected(this,"function parameters");
          return false;
        }
      }
      else {
        pTVar3 = HlslParseContext::handleDotDereference
                           (this->parseContext,(TSourceLoc *)&thisNode,
                            (TIntermTyped *)
                            ((idToken.field_2.string)->_M_dataplus).super_allocator_type.allocator,
                            (TString *)field._24_8_);
        ((idToken.field_2.string)->_M_dataplus).super_allocator_type.allocator =
             (TPoolAllocator *)pTVar3;
      }
    }
  }
  return true;
}

Assistant:

bool HlslGrammar::acceptPostfixExpression(TIntermTyped*& node)
{
    // Not implemented as self-recursive:
    // The logical "right recursion" is done with a loop at the end

    // idToken will pick up either a variable or a function name in a function call
    HlslToken idToken;

    // Find something before the postfix operations, as they can't operate
    // on nothing.  So, no "return true", they fall through, only "return false".
    if (acceptTokenClass(EHTokLeftParen)) {
        // LEFT_PAREN expression RIGHT_PAREN
        if (! acceptExpression(node)) {
            expected("expression");
            return false;
        }
        if (! acceptTokenClass(EHTokRightParen)) {
            expected(")");
            return false;
        }
    } else if (acceptLiteral(node)) {
        // literal (nothing else to do yet)
    } else if (acceptConstructor(node)) {
        // constructor (nothing else to do yet)
    } else if (acceptIdentifier(idToken)) {
        // user-type, namespace name, variable, or function name
        TString* fullName = idToken.string;
        while (acceptTokenClass(EHTokColonColon)) {
            // user-type or namespace name
            fullName = NewPoolTString(fullName->c_str());
            fullName->append(parseContext.scopeMangler);
            if (acceptIdentifier(idToken))
                fullName->append(*idToken.string);
            else {
                expected("identifier after ::");
                return false;
            }
        }
        if (! peekTokenClass(EHTokLeftParen)) {
            node = parseContext.handleVariable(idToken.loc, fullName);
            if (node == nullptr)
                return false;
        } else if (acceptFunctionCall(idToken.loc, *fullName, node, nullptr)) {
            // function_call (nothing else to do yet)
        } else {
            expected("function call arguments");
            return false;
        }
    } else {
        // nothing found, can't post operate
        return false;
    }

    // Something was found, chain as many postfix operations as exist.
    do {
        TSourceLoc loc = token.loc;
        TOperator postOp = HlslOpMap::postUnary(peek());

        // Consume only a valid post-unary operator, otherwise we are done.
        switch (postOp) {
        case EOpIndexDirectStruct:
        case EOpIndexIndirect:
        case EOpPostIncrement:
        case EOpPostDecrement:
        case EOpScoping:
            advanceToken();
            break;
        default:
            return true;
        }

        // We have a valid post-unary operator, process it.
        switch (postOp) {
        case EOpScoping:
        case EOpIndexDirectStruct:
        {
            // DOT IDENTIFIER
            // includes swizzles, member variables, and member functions
            HlslToken field;
            if (! acceptIdentifier(field)) {
                expected("swizzle or member");
                return false;
            }

            if (peekTokenClass(EHTokLeftParen)) {
                // member function
                TIntermTyped* thisNode = node;

                // arguments
                if (! acceptFunctionCall(field.loc, *field.string, node, thisNode)) {
                    expected("function parameters");
                    return false;
                }
            } else
                node = parseContext.handleDotDereference(field.loc, node, *field.string);

            break;
        }
        case EOpIndexIndirect:
        {
            // LEFT_BRACKET integer_expression RIGHT_BRACKET
            TIntermTyped* indexNode = nullptr;
            if (! acceptExpression(indexNode) ||
                ! peekTokenClass(EHTokRightBracket)) {
                expected("expression followed by ']'");
                return false;
            }
            advanceToken();
            node = parseContext.handleBracketDereference(indexNode->getLoc(), node, indexNode);
            if (node == nullptr)
                return false;
            break;
        }
        case EOpPostIncrement:
            // INC_OP
            // fall through
        case EOpPostDecrement:
            // DEC_OP
            node = intermediate.addUnaryMath(postOp, node, loc);
            node = parseContext.handleLvalue(loc, "unary operator", node);
            break;
        default:
            assert(0);
            break;
        }
    } while (true);
}